

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseOptionNamePart
          (Parser *this,UninterpretedOption *uninterpreted_option,LocationRecorder *part_location)

{
  void **ppvVar1;
  bool bVar2;
  int iVar3;
  UninterpretedOption_NamePart *pUVar4;
  string *psVar5;
  int iVar6;
  LocationRecorder location;
  string identifier;
  LocationRecorder local_60;
  string local_50;
  
  iVar3 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_;
  iVar6 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.allocated_size_;
  if (iVar3 < iVar6) {
    ppvVar1 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.elements_;
    (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
    pUVar4 = (UninterpretedOption_NamePart *)ppvVar1[iVar3];
  }
  else {
    if (iVar6 == (uninterpreted_option->name_).super_RepeatedPtrFieldBase.total_size_) {
      internal::RepeatedPtrFieldBase::Reserve
                (&(uninterpreted_option->name_).super_RepeatedPtrFieldBase,iVar6 + 1);
      iVar6 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.allocated_size_;
    }
    (uninterpreted_option->name_).super_RepeatedPtrFieldBase.allocated_size_ = iVar6 + 1;
    pUVar4 = internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>::New();
    ppvVar1 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.elements_;
    iVar3 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_;
    (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
    ppvVar1[iVar3] = pUVar4;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
  if (iVar3 == 0) {
    bVar2 = Consume(this,"(");
    if (bVar2) {
      LocationRecorder::Init(&local_60,part_location);
      LocationRecorder::AddPath(&local_60,1);
      if ((this->input_->current_).type == TYPE_IDENTIFIER) {
        bVar2 = ConsumeIdentifier(this,&local_50,"Expected identifier.");
        if (!bVar2) goto LAB_00218161;
        *(byte *)pUVar4->_has_bits_ = (byte)pUVar4->_has_bits_[0] | 1;
        psVar5 = pUVar4->name_part_;
        if (psVar5 == (string *)internal::kEmptyString_abi_cxx11_) {
          psVar5 = (string *)operator_new(0x20);
          (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
          psVar5->_M_string_length = 0;
          (psVar5->field_2)._M_local_buf[0] = '\0';
          pUVar4->name_part_ = psVar5;
        }
        std::__cxx11::string::_M_append((char *)psVar5,(ulong)local_50._M_dataplus._M_p);
      }
      while( true ) {
        iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
        if (iVar3 != 0) break;
        bVar2 = Consume(this,".");
        if (!bVar2) goto LAB_00218161;
        *(byte *)pUVar4->_has_bits_ = (byte)pUVar4->_has_bits_[0] | 1;
        psVar5 = pUVar4->name_part_;
        if (psVar5 == (string *)internal::kEmptyString_abi_cxx11_) {
          psVar5 = (string *)operator_new(0x20);
          (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
          psVar5->_M_string_length = 0;
          (psVar5->field_2)._M_local_buf[0] = '\0';
          pUVar4->name_part_ = psVar5;
        }
        std::__cxx11::string::append((char *)psVar5);
        bVar2 = ConsumeIdentifier(this,&local_50,"Expected identifier.");
        if (!bVar2) goto LAB_00218161;
        *(byte *)pUVar4->_has_bits_ = (byte)pUVar4->_has_bits_[0] | 1;
        psVar5 = pUVar4->name_part_;
        if (psVar5 == (string *)internal::kEmptyString_abi_cxx11_) {
          psVar5 = (string *)operator_new(0x20);
          (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
          psVar5->_M_string_length = 0;
          (psVar5->field_2)._M_local_buf[0] = '\0';
          pUVar4->name_part_ = psVar5;
        }
        std::__cxx11::string::_M_append((char *)psVar5,(ulong)local_50._M_dataplus._M_p);
      }
      LocationRecorder::~LocationRecorder(&local_60);
      bVar2 = Consume(this,")");
      if (bVar2) {
        *(byte *)pUVar4->_has_bits_ = (byte)pUVar4->_has_bits_[0] | 2;
        pUVar4->is_extension_ = true;
        goto LAB_00217fe5;
      }
    }
  }
  else {
    LocationRecorder::Init(&local_60,part_location);
    LocationRecorder::AddPath(&local_60,1);
    bVar2 = ConsumeIdentifier(this,&local_50,"Expected identifier.");
    if (bVar2) {
      *(byte *)pUVar4->_has_bits_ = (byte)pUVar4->_has_bits_[0] | 1;
      psVar5 = pUVar4->name_part_;
      if (psVar5 == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar5 = (string *)operator_new(0x20);
        (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
        psVar5->_M_string_length = 0;
        (psVar5->field_2)._M_local_buf[0] = '\0';
        pUVar4->name_part_ = psVar5;
      }
      std::__cxx11::string::_M_append((char *)psVar5,(ulong)local_50._M_dataplus._M_p);
      *(byte *)pUVar4->_has_bits_ = (byte)pUVar4->_has_bits_[0] | 2;
      pUVar4->is_extension_ = false;
      LocationRecorder::~LocationRecorder(&local_60);
LAB_00217fe5:
      bVar2 = true;
      goto LAB_0021816d;
    }
LAB_00218161:
    LocationRecorder::~LocationRecorder(&local_60);
  }
  bVar2 = false;
LAB_0021816d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool Parser::ParseOptionNamePart(UninterpretedOption* uninterpreted_option,
                                 const LocationRecorder& part_location) {
  UninterpretedOption::NamePart* name = uninterpreted_option->add_name();
  string identifier;  // We parse identifiers into this string.
  if (LookingAt("(")) {  // This is an extension.
    DO(Consume("("));

    {
      LocationRecorder location(
          part_location, UninterpretedOption::NamePart::kNamePartFieldNumber);
      // An extension name consists of dot-separated identifiers, and may begin
      // with a dot.
      if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
        DO(ConsumeIdentifier(&identifier, "Expected identifier."));
        name->mutable_name_part()->append(identifier);
      }
      while (LookingAt(".")) {
        DO(Consume("."));
        name->mutable_name_part()->append(".");
        DO(ConsumeIdentifier(&identifier, "Expected identifier."));
        name->mutable_name_part()->append(identifier);
      }
    }

    DO(Consume(")"));
    name->set_is_extension(true);
  } else {  // This is a regular field.
    LocationRecorder location(
        part_location, UninterpretedOption::NamePart::kNamePartFieldNumber);
    DO(ConsumeIdentifier(&identifier, "Expected identifier."));
    name->mutable_name_part()->append(identifier);
    name->set_is_extension(false);
  }
  return true;
}